

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O0

void sysbvm_bytecodeJit_refSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tupleReference,sysbvm_tuple_t typeSlot,
               sysbvm_tuple_t value)

{
  size_t slotIndex_00;
  sysbvm_tuple_t tuple;
  size_t slotIndex;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t typeSlot_local;
  sysbvm_tuple_t tupleReference_local;
  sysbvm_context_t *context_local;
  
  slotIndex_00 = sysbvm_typeSlot_getIndex(typeSlot);
  tuple = sysbvm_pointerLikeType_load(context,tupleReference);
  sysbvm_tuple_slotAtPut(context,tuple,slotIndex_00,value);
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_refSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tupleReference, sysbvm_tuple_t typeSlot, sysbvm_tuple_t value)
{
    size_t slotIndex = sysbvm_typeSlot_getIndex(typeSlot);
    sysbvm_tuple_slotAtPut(context, sysbvm_pointerLikeType_load(context, tupleReference), slotIndex, value);
}